

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeGenericDeclarations
          (StringTree *__return_storage_ptr__,CapnpcCppMain *this,TemplateContext *templateContext,
          bool hasBrandDependencies)

{
  size_t sVar1;
  Branch *pBVar2;
  int iVar3;
  StringTree *pSVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  StringTree local_50;
  
  pcVar5 = "";
  if ((int)templateContext != 0) {
    pcVar5 = "    static const ::capnp::_::RawBrandedSchema::Dependency brandDependencies[];\n";
  }
  TemplateContext::allArgs(&local_50,(TemplateContext *)this);
  pSVar4 = kj::
           strTree<char_const(&)[141],char_const*,char_const(&)[175],kj::StringTree,char_const(&)[15]>
                     (__return_storage_ptr__,
                      (kj *)
                      "    static const ::capnp::_::RawBrandedSchema::Scope brandScopes[];\n    static const ::capnp::_::RawBrandedSchema::Binding brandBindings[];\n"
                      ,(char (*) [141])&stack0xffffffffffffffa8,
                      (char **)
                      "    static const ::capnp::_::RawBrandedSchema specificBrand;\n    static constexpr ::capnp::_::RawBrandedSchema const* brand() { return ::capnp::_::ChooseBrand<_capnpPrivate, "
                      ,(char (*) [175])&local_50,(StringTree *)">::brand(); }\n",
                      (char (*) [15])pcVar5);
  sVar1 = local_50.branches.size_;
  pBVar2 = local_50.branches.ptr;
  if (local_50.branches.ptr != (Branch *)0x0) {
    local_50.branches.ptr = (Branch *)0x0;
    local_50.branches.size_ = 0;
    iVar3 = (**(local_50.branches.disposer)->_vptr_ArrayDisposer)
                      (local_50.branches.disposer,pBVar2,0x40,sVar1,sVar1,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    pSVar4 = (StringTree *)CONCAT44(extraout_var,iVar3);
  }
  sVar1 = local_50.text.content.size_;
  pcVar5 = local_50.text.content.ptr;
  if (local_50.text.content.ptr != (char *)0x0) {
    local_50.text.content.ptr = (char *)0x0;
    local_50.text.content.size_ = 0;
    iVar3 = (**(local_50.text.content.disposer)->_vptr_ArrayDisposer)
                      (local_50.text.content.disposer,pcVar5,1,sVar1,sVar1,0);
    pSVar4 = (StringTree *)CONCAT44(extraout_var_00,iVar3);
  }
  return pSVar4;
}

Assistant:

kj::StringTree makeGenericDeclarations(const TemplateContext& templateContext,
                                         bool hasBrandDependencies) {
    // Returns the declarations for the private members of a generic struct/interface;
    // paired with the definitions from makeGenericDefinitions().
    return kj::strTree(
        "    static const ::capnp::_::RawBrandedSchema::Scope brandScopes[];\n"
        "    static const ::capnp::_::RawBrandedSchema::Binding brandBindings[];\n",
        (!hasBrandDependencies ? "" :
            "    static const ::capnp::_::RawBrandedSchema::Dependency brandDependencies[];\n"),
        "    static const ::capnp::_::RawBrandedSchema specificBrand;\n"
        "    static constexpr ::capnp::_::RawBrandedSchema const* brand() { "
        "return ::capnp::_::ChooseBrand<_capnpPrivate, ", templateContext.allArgs(), ">::brand(); }\n");
  }